

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> * __thiscall
OpenMD::Thermo::getCurrentDensity(Thermo *this)

{
  bool bVar1;
  SnapshotManager *this_00;
  difference_type dVar2;
  value_type *__x;
  value_type *pvVar3;
  ulong uVar4;
  size_type sVar5;
  undefined8 *in_RSI;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *in_RDI;
  RealType RVar6;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *pvVar7;
  Vector<double,_3U> *this_01;
  uint j_1;
  uint j;
  RealType vol;
  RigidBody *in_stack_000000d0;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  int typeIndex;
  RealType q;
  Vector3d v;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> typeJc;
  Vector3d Jc;
  iterator at;
  AtomType *atype;
  Atom *atom;
  RigidBody *rb;
  Molecule *mol;
  iterator ri;
  iterator iiter;
  MoleculeIterator miter;
  AtomTypeSet simTypes;
  Snapshot *snap;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *result;
  set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  *in_stack_fffffffffffffda8;
  Snapshot *in_stack_fffffffffffffdb0;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> in_stack_fffffffffffffdb8;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> in_stack_fffffffffffffdc0;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *this_02;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> in_stack_fffffffffffffdc8;
  SimInfo *in_stack_fffffffffffffdd0;
  SimInfo *in_stack_fffffffffffffe38;
  uint local_19c;
  uint local_194;
  _Self local_148;
  _Base_ptr local_140;
  _Base_ptr local_138;
  _Base_ptr local_130;
  FluctuatingChargeAdapter local_128;
  FixedChargeAdapter local_120;
  int local_114;
  RealType local_110;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_e8;
  double local_c0;
  Vector<double,_3U> local_b8 [2];
  _Rb_tree_const_iterator<OpenMD::AtomType_*> local_88;
  AtomType *local_80;
  SimInfo *local_78;
  RigidBody *local_70;
  Molecule *local_68;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_60;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_58;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_50 [7];
  Snapshot *local_18;
  
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RSI);
  local_18 = SnapshotManager::getCurrentSnapshot(this_00);
  SimInfo::getSimulatedAtomTypes(in_stack_fffffffffffffe38);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_50);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_58);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator(&local_60);
  std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::_Rb_tree_const_iterator(&local_88);
  local_c0 = 0.0;
  Vector<double,_3U>::Vector(local_b8,&local_c0);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffdb0,
             (Vector<double,_3U> *)in_stack_fffffffffffffda8);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::size
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x15aa18);
  std::allocator<OpenMD::Vector3<double>_>::allocator
            ((allocator<OpenMD::Vector3<double>_> *)0x15aa35);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             in_stack_fffffffffffffdd0,(size_type)in_stack_fffffffffffffdc8._M_node,
             (value_type *)in_stack_fffffffffffffdc0._M_node,
             (allocator_type *)in_stack_fffffffffffffdb8._M_node);
  std::allocator<OpenMD::Vector3<double>_>::~allocator
            ((allocator<OpenMD::Vector3<double>_> *)0x15aa68);
  local_68 = SimInfo::beginMolecule
                       (in_stack_fffffffffffffdd0,
                        (MoleculeIterator *)in_stack_fffffffffffffdc8._M_node);
  while (local_68 != (Molecule *)0x0) {
    local_70 = Molecule::beginRigidBody
                         ((Molecule *)in_stack_fffffffffffffdd0,
                          (iterator *)in_stack_fffffffffffffdc8._M_node);
    while (local_70 != (RigidBody *)0x0) {
      RigidBody::updateAtomVel(in_stack_000000d0);
      local_70 = Molecule::nextRigidBody
                           ((Molecule *)in_stack_fffffffffffffdd0,
                            (iterator *)in_stack_fffffffffffffdc8._M_node);
    }
    local_78 = (SimInfo *)
               Molecule::beginAtom((Molecule *)in_stack_fffffffffffffdd0,
                                   (iterator *)in_stack_fffffffffffffdc8._M_node);
    while (local_78 != (SimInfo *)0x0) {
      StuntDouble::getVel((StuntDouble *)in_stack_fffffffffffffdb8._M_node);
      local_110 = 0.0;
      local_114 = 0xffffffff;
      local_80 = Atom::getAtomType((Atom *)local_78);
      FixedChargeAdapter::FixedChargeAdapter(&local_120,local_80);
      bVar1 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x15ac26);
      if (bVar1) {
        local_110 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_fffffffffffffdb0);
      }
      FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_128,local_80);
      bVar1 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x15ac7e);
      if (bVar1) {
        RVar6 = StuntDouble::getFlucQPos((StuntDouble *)in_stack_fffffffffffffdb0);
        local_110 = RVar6 + local_110;
      }
      local_114 = -1;
      local_138 = (_Base_ptr)
                  std::
                  set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                  ::begin(in_stack_fffffffffffffda8);
      local_140 = (_Base_ptr)
                  std::
                  set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                  ::end(in_stack_fffffffffffffda8);
      local_130 = (_Base_ptr)
                  std::find<std::_Rb_tree_const_iterator<OpenMD::AtomType*>,OpenMD::AtomType*>
                            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                             in_stack_fffffffffffffdb8._M_node);
      local_88 = (_Rb_tree_const_iterator<OpenMD::AtomType_*>)local_130;
      local_148._M_node =
           (_Base_ptr)
           std::
           set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
           end(in_stack_fffffffffffffda8);
      bVar1 = std::operator!=(&local_88,&local_148);
      if (bVar1) {
        std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
        begin(in_stack_fffffffffffffda8);
        dVar2 = std::distance<std::_Rb_tree_const_iterator<OpenMD::AtomType*>>
                          (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        local_114 = (int)dVar2;
      }
      if (local_114 != -1) {
        OpenMD::operator*((double)in_stack_fffffffffffffdb8._M_node,
                          (Vector<double,_3U> *)in_stack_fffffffffffffdb0);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  (&local_e8,(long)local_114);
        Vector<double,_3U>::operator+=
                  ((Vector<double,_3U> *)in_stack_fffffffffffffdb0,
                   (Vector<double,_3U> *)in_stack_fffffffffffffda8);
      }
      OpenMD::operator*((double)in_stack_fffffffffffffdb8._M_node,
                        (Vector<double,_3U> *)in_stack_fffffffffffffdb0);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffffdb0,
                 (Vector<double,_3U> *)in_stack_fffffffffffffda8);
      in_stack_fffffffffffffdd0 =
           (SimInfo *)
           Molecule::nextAtom((Molecule *)in_stack_fffffffffffffdd0,
                              (iterator *)in_stack_fffffffffffffdc8._M_node);
      local_78 = in_stack_fffffffffffffdd0;
    }
    in_stack_fffffffffffffdc8._M_node =
         (_Base_ptr)
         SimInfo::nextMolecule(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8._M_node);
    local_68 = (Molecule *)in_stack_fffffffffffffdc8._M_node;
  }
  pvVar7 = (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
           Snapshot::getVolume(in_stack_fffffffffffffdb0);
  this_02 = pvVar7;
  Vector<double,_3U>::operator/=
            ((Vector<double,_3U> *)in_stack_fffffffffffffdb0,(double)in_stack_fffffffffffffda8);
  local_194 = 0;
  while( true ) {
    __x = (value_type *)(ulong)local_194;
    pvVar3 = (value_type *)
             std::
             set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
             size((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                   *)0x15af09);
    if (pvVar3 <= __x) break;
    this_01 = (Vector<double,_3U> *)((double)pvVar7 * 6.241573027317e-17);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              (&local_e8,(ulong)local_194);
    Vector<double,_3U>::operator/=(this_01,(double)in_stack_fffffffffffffda8);
    local_194 = local_194 + 1;
  }
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x15af81)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::clear
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x15af8e)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            (this_02,__x);
  local_19c = 0;
  while( true ) {
    uVar4 = (ulong)local_19c;
    sVar5 = std::
            set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
            size((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                  *)0x15afc8);
    if (sVar5 <= uVar4) break;
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              (&local_e8,(ulong)local_19c);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
              (this_02,__x);
    local_19c = local_19c + 1;
  }
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector(this_02);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::~set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x15b06d);
  return in_RDI;
}

Assistant:

std::vector<Vector3d> Thermo::getCurrentDensity() {
    Snapshot* snap       = info_->getSnapshotManager()->getCurrentSnapshot();
    AtomTypeSet simTypes = info_->getSimulatedAtomTypes();

    SimInfo::MoleculeIterator miter;
    std::vector<Atom*>::iterator iiter;
    std::vector<RigidBody*>::iterator ri;
    Molecule* mol;
    RigidBody* rb;
    Atom* atom;
    AtomType* atype;
    AtomTypeSet::iterator at;
    Vector3d Jc(0.0);
    std::vector<Vector3d> typeJc(simTypes.size(), V3Zero);

    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      // change the velocities of atoms which belong to the rigidbodies
      for (rb = mol->beginRigidBody(ri); rb != NULL;
           rb = mol->nextRigidBody(ri)) {
        rb->updateAtomVel();
      }

      for (atom = mol->beginAtom(iiter); atom != NULL;
           atom = mol->nextAtom(iiter)) {
        Vector3d v = atom->getVel();
        RealType q = 0.0;
        int typeIndex(-1);

        atype                  = atom->getAtomType();
        FixedChargeAdapter fca = FixedChargeAdapter(atype);
        if (fca.isFixedCharge()) q = fca.getCharge();
        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
        if (fqa.isFluctuatingCharge()) q += atom->getFlucQPos();

        typeIndex = -1;
        at        = std::find(simTypes.begin(), simTypes.end(), atype);
        if (at != simTypes.end()) {
          typeIndex = std::distance(simTypes.begin(), at);
        }

        if (typeIndex != -1) { typeJc[typeIndex] += q * v; }
        Jc += q * v;
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &Jc[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    for (unsigned int j = 0; j < simTypes.size(); j++) {
      MPI_Allreduce(MPI_IN_PLACE, &typeJc[j][0], 3, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
    }
#endif

    RealType vol = snap->getVolume();

    Jc /= (vol * Constants::currentDensityConvert);
    for (unsigned int j = 0; j < simTypes.size(); j++) {
      typeJc[j] /= (vol * Constants::currentDensityConvert);
    }

    std::vector<Vector3d> result;
    result.clear();

    result.push_back(Jc);
    for (unsigned int j = 0; j < simTypes.size(); j++)
      result.push_back(typeJc[j]);

    return result;
  }